

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v11::detail::do_format_decimal<char,unsigned_long>
                 (char *out,unsigned_long value,int size)

{
  ulong uVar1;
  uint uVar2;
  
  do_count_digits(value);
  uVar2 = size - 2;
  for (; uVar1 = (ulong)uVar2, 99 < value; value = value / 100) {
    *(undefined2 *)(out + uVar1) = *(undefined2 *)(digits2(unsigned_long)::data + (value % 100) * 2)
    ;
    uVar2 = uVar2 - 2;
  }
  if (value < 10) {
    uVar1 = (ulong)(uVar2 + 1);
    out[uVar1] = (byte)value | 0x30;
  }
  else {
    *(undefined2 *)(out + uVar1) = *(undefined2 *)(digits2(unsigned_long)::data + value * 2);
  }
  return out + uVar1;
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}